

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O1

Result<kernel::ChainstateManagerOpts> *
validation_chainstatemanager_tests::SetOptsFromArgs<kernel::ChainstateManagerOpts>
          (Result<kernel::ChainstateManagerOpts> *__return_storage_ptr__,ArgsManager *args_man,
          ChainstateManagerOpts opts,vector<const_char_*,_std::allocator<const_char_*>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char **ppcVar3;
  char **argv;
  iterator __position;
  char **ppcVar4;
  bool bVar5;
  long *in_RCX;
  long lVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar7;
  undefined8 *puVar8;
  char **arg;
  char **__args;
  long in_FS_OFFSET;
  byte bVar9;
  initializer_list<const_char_*> __l;
  Result<void> result;
  string error;
  vector<const_char_*,_std::allocator<const_char_*>_> local_228;
  pointer local_210;
  path local_208;
  pointer local_1e0;
  undefined1 local_1d8;
  undefined4 local_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined8 local_1c4;
  undefined8 uStack_1bc;
  undefined1 local_1b4;
  undefined8 local_1b0 [14];
  bilingual_str local_140;
  _Variadic_union<bilingual_str,_std::monostate> local_100;
  char local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  string local_58;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100._0_8_ = (long)"dec_ignore == in_ignore" + 0x11;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_100;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_228,__l,(allocator_type *)&local_58);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_228,
             (in_RCX[1] - *in_RCX >> 3) +
             ((long)local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3));
  ppcVar3 = (char **)in_RCX[1];
  argv = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  __position._M_current =
       local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ppcVar4 = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  for (__args = (char **)*in_RCX; __args != ppcVar3; __args = __args + 1) {
    local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = argv;
    local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppcVar4;
    if (__position._M_current == ppcVar4) {
      local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_228,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    argv = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    __position._M_current =
         local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ppcVar4 = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar5 = ArgsManager::ParseParameters
                    (args_man,(int)((ulong)((long)__position._M_current - (long)argv) >> 3),argv,
                     &local_58);
  if (bVar5) {
    ::node::ApplyArgsManOptions((Result<void> *)&local_100._M_first,args_man,(Options *)args);
    if (local_c0 == '\x01') {
      local_210 = (args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      std::filesystem::__cxx11::path::path
                (&local_208,
                 (path *)&(args->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish);
      local_1d8 = *(undefined1 *)
                   &args[2].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_1e0 = args[2].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1b4 = *(char *)((long)&args[3].
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == '\x01';
      if ((bool)local_1b4) {
        local_1d4 = *(undefined4 *)
                     ((long)&args[2].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
        uStack_1d0 = *(undefined4 *)
                      &args[2].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        uStack_1cc = *(undefined4 *)
                      ((long)&args[2].
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        uStack_1c8 = *(undefined4 *)
                      &args[3].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        local_1c4 = *(undefined8 *)
                     ((long)&args[3].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4);
        uStack_1bc = *(undefined8 *)
                      ((long)&args[3].
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 4);
      }
      pvVar7 = args + 4;
      puVar8 = local_1b0;
      for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = (pvVar7->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar7 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
                 ((long)pvVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      std::__detail::__variant::_Uninitialized<kernel::ChainstateManagerOpts,_false>::
      _Uninitialized<kernel::ChainstateManagerOpts>
                ((_Uninitialized<kernel::ChainstateManagerOpts,_false> *)__return_storage_ptr__,
                 &local_210);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0xd0) =
           '\x01';
      std::filesystem::__cxx11::path::~path(&local_208);
    }
    else {
      util::ErrorString<void>(&local_140,(Result<void> *)&local_100._M_first);
      puVar8 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> = puVar8;
      paVar1 = &local_140.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.original._M_dataplus._M_p == paVar1) {
        *puVar8 = CONCAT71(local_140.original.field_2._M_allocated_capacity._1_7_,
                           local_140.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x18)
             = local_140.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
          super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
          super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
          super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
          super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
          super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> =
             local_140.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts>
                  + 0x10) =
             CONCAT71(local_140.original.field_2._M_allocated_capacity._1_7_,
                      local_140.original.field_2._M_local_buf[0]);
      }
      paVar2 = &local_140.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 8) =
           local_140.original._M_string_length;
      local_140.original._M_string_length = 0;
      local_140.original.field_2._M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                       super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x20) =
           puVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.translated._M_dataplus._M_p == paVar2) {
        *puVar8 = CONCAT71(local_140.translated.field_2._M_allocated_capacity._1_7_,
                           local_140.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x38)
             = local_140.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                 super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x20)
             = local_140.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                          super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts>
                  + 0x30) =
             CONCAT71(local_140.translated.field_2._M_allocated_capacity._1_7_,
                      local_140.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x28) =
           local_140.translated._M_string_length;
      local_140.translated._M_string_length = 0;
      local_140.translated.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0xd0) =
           '\0';
      local_140.original._M_dataplus._M_p = (pointer)paVar1;
      local_140.translated._M_dataplus._M_p = (pointer)paVar2;
    }
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&local_100._M_first)
    ;
  }
  else {
    std::operator+(&local_b8,"ParseParameters failed with error: ",&local_58);
    local_98 = &local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    puVar8 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
      super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
      super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
      super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
      super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
      super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> = puVar8;
    if (local_98 == &local_88) {
      *puVar8 = CONCAT71(uStack_87,local_88);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x18) =
           uStack_80;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
        super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
                0x10) = CONCAT71(uStack_87,local_88);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 8) =
         local_90;
    puVar8 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                     super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
             0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x20) =
         puVar8;
    if (local_78 == &local_68) {
      *puVar8 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x38) =
           uStack_60;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
               super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x20) =
           local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
                        super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> +
                0x30) = CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0x28) =
         local_70;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_assign_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Move_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Copy_ctor_alias<bilingual_str,_kernel::ChainstateManagerOpts>.
             super__Variant_storage_alias<bilingual_str,_kernel::ChainstateManagerOpts> + 0xd0) =
         '\0';
    local_68 = 0;
    local_70 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = &local_88;
    local_78 = &local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (argv != (char **)0x0) {
    operator_delete(argv,(long)ppcVar4 - (long)argv);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<Options> SetOptsFromArgs(ArgsManager& args_man, Options opts,
                                      const std::vector<const char*>& args)
{
    const auto argv{Cat({"ignore"}, args)};
    std::string error{};
    if (!args_man.ParseParameters(argv.size(), argv.data(), error)) {
        return util::Error{Untranslated("ParseParameters failed with error: " + error)};
    }
    const auto result{node::ApplyArgsManOptions(args_man, opts)};
    if (!result) return util::Error{util::ErrorString(result)};
    return opts;
}